

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

void __thiscall
kj::Canceler::AdapterImpl<capnp::Capability::Client>::AdapterImpl
          (AdapterImpl<capnp::Capability::Client> *this,
          PromiseFulfiller<capnp::Capability::Client> *fulfiller,Canceler *canceler,
          Promise<capnp::Capability::Client> *inner)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation local_88 [2];
  SourceLocation local_58;
  Canceler *local_40;
  Type local_38;
  Promise<capnp::Capability::Client> local_30;
  Promise<capnp::Capability::Client> *local_28;
  Promise<capnp::Capability::Client> *inner_local;
  Canceler *canceler_local;
  PromiseFulfiller<capnp::Capability::Client> *fulfiller_local;
  AdapterImpl<capnp::Capability::Client> *this_local;
  
  local_28 = inner;
  inner_local = (Promise<capnp::Capability::Client> *)canceler;
  canceler_local = (Canceler *)fulfiller;
  fulfiller_local = (PromiseFulfiller<capnp::Capability::Client> *)this;
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_0059c388;
  this->fulfiller = (PromiseFulfiller<capnp::Capability::Client> *)canceler_local;
  local_38.fulfiller = (PromiseFulfiller<capnp::Capability::Client> *)canceler_local;
  local_40 = canceler_local;
  SourceLocation::SourceLocation
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h"
             ,"AdapterImpl",0x393,0x11);
  location.function = local_58.function;
  location.fileName = local_58.fileName;
  location.lineNumber = local_58.lineNumber;
  location.columnNumber = local_58.columnNumber;
  Promise<capnp::Capability::Client>::
  then<kj::Canceler::AdapterImpl<capnp::Capability::Client>::AdapterImpl(kj::PromiseFulfiller<capnp::Capability::Client>&,kj::Canceler&,kj::Promise<capnp::Capability::Client>)::_lambda(capnp::Capability::Client&&)_1_,kj::Canceler::AdapterImpl<capnp::Capability::Client>::PromiseFulfiller(kj::PromiseFulfiller<capnp::Capability::Client>&,kj::Canceler&,kj::Promise<capnp::Capability::Client>)::_lambda(kj::Exception&&)_1_>
            (&local_30,(Type *)inner,&local_38,location);
  SourceLocation::SourceLocation
            (local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h"
             ,"AdapterImpl",0x393,0x11);
  location_00.function = local_88[0].function;
  location_00.fileName = local_88[0].fileName;
  location_00.lineNumber = local_88[0].lineNumber;
  location_00.columnNumber = local_88[0].columnNumber;
  Promise<void>::eagerlyEvaluate(&this->inner,&local_30,location_00);
  Promise<void>::~Promise((Promise<void> *)&local_30);
  return;
}

Assistant:

AdapterImpl(PromiseFulfiller<T>& fulfiller,
                Canceler& canceler, Promise<T> inner)
        : AdapterBase(canceler),
          fulfiller(fulfiller),
          inner(inner.then(
              [&fulfiller](T&& value) { fulfiller.fulfill(kj::mv(value)); },
              [&fulfiller](Exception&& e) { fulfiller.reject(kj::mv(e)); })
              .eagerlyEvaluate(nullptr)) {}